

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestCase *_testCase,string *_className,
                   string *_name,string *_descOrTags,SourceLineInfo *_lineInfo)

{
  char cVar1;
  size_t this;
  bool bVar2;
  SpecialProperties SVar3;
  bool bVar4;
  size_t i;
  ulong uVar5;
  bool bVar6;
  undefined1 local_1e0 [8];
  TestCaseInfo info;
  string desc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  undefined1 local_60 [8];
  string tag;
  allocator local_31;
  
  tag.field_2._8_8_ = _lineInfo;
  std::__cxx11::string::string
            ((string *)local_1e0,"./",(allocator *)(desc.field_2._M_local_buf + 8));
  tags._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)__return_storage_ptr__;
  bVar2 = startsWith(_name,(string *)local_1e0);
  std::__cxx11::string::~string((string *)local_1e0);
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tags;
  tags._M_t._M_impl._0_4_ = 0;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  info._264_8_ = &desc._M_string_length;
  desc._M_dataplus._M_p = (pointer)0x0;
  desc._M_string_length._0_1_ = 0;
  local_60 = (undefined1  [8])&tag._M_string_length;
  tag._M_dataplus._M_p = (pointer)0x0;
  tag._M_string_length._0_1_ = 0;
  bVar6 = false;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  for (uVar5 = 0; this = tags._M_t._M_impl.super__Rb_tree_header._M_node_count,
      uVar5 < _descOrTags->_M_string_length; uVar5 = uVar5 + 1) {
    cVar1 = (_descOrTags->_M_dataplus)._M_p[uVar5];
    if (bVar6) {
      if (cVar1 == ']') {
        SVar3 = parseSpecialTag((string *)local_60);
        if (SVar3 == None) {
          enforceNotReservedTag((string *)local_60,(SourceLineInfo *)tag.field_2._8_8_);
          bVar4 = bVar2;
        }
        else {
          bVar4 = true;
          if (SVar3 != IsHidden) {
            bVar4 = bVar2;
          }
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(desc.field_2._M_local_buf + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
        tag._M_dataplus._M_p = (pointer)0x0;
        *(char *)local_60 = '\0';
        bVar6 = false;
        bVar2 = bVar4;
      }
      else {
        bVar6 = true;
        std::__cxx11::string::push_back((char)local_60);
      }
    }
    else {
      bVar6 = true;
      if (cVar1 != '[') {
        std::__cxx11::string::push_back((char)&info + '\b');
        bVar6 = false;
      }
    }
  }
  if (bVar2 != false) {
    std::__cxx11::string::string((string *)local_1e0,"hide",&local_31);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)(desc.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::string::string((string *)local_1e0,".",&local_31);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)(desc.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
    std::__cxx11::string::~string((string *)local_1e0);
  }
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_1e0,_name,_className,(string *)&info.properties,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&desc.field_2 + 8),(SourceLineInfo *)tag.field_2._8_8_);
  TestCase::TestCase((TestCase *)this,_testCase,(TestCaseInfo *)local_1e0);
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_1e0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)&info.properties);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&desc.field_2 + 8));
  return (TestCase *)this;
}

Assistant:

TestCase makeTestCase(ITestCase* _testCase,
		std::string const& _className,
		std::string const& _name,
		std::string const& _descOrTags,
		SourceLineInfo const& _lineInfo)
	{
		bool isHidden(startsWith(_name, "./")); // Legacy support

												// Parse out tags
		std::set<std::string> tags;
		std::string desc, tag;
		bool inTag = false;
		for (std::size_t i = 0; i < _descOrTags.size(); ++i) {
			char c = _descOrTags[i];
			if (!inTag) {
				if (c == '[')
					inTag = true;
				else
					desc += c;
			}
			else {
				if (c == ']') {
					TestCaseInfo::SpecialProperties prop = parseSpecialTag(tag);
					if (prop == TestCaseInfo::IsHidden)
						isHidden = true;
					else if (prop == TestCaseInfo::None)
						enforceNotReservedTag(tag, _lineInfo);

					tags.insert(tag);
					tag.clear();
					inTag = false;
				}
				else
					tag += c;
			}
		}
		if (isHidden) {
			tags.insert("hide");
			tags.insert(".");
		}

		TestCaseInfo info(_name, _className, desc, tags, _lineInfo);
		return TestCase(_testCase, info);
	}